

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O1

string * cppcms::impl::make_scgi_header
                   (string *__return_storage_ptr__,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *env,size_t addon_size)

{
  _Rb_tree_header *p_Var1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  string env_str;
  undefined1 *local_70;
  unsigned_long local_68;
  undefined1 local_60 [16];
  key_type local_50;
  
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  std::__cxx11::string::reserve((ulong)&local_70);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CONTENT_LENGTH","");
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&env->_M_t,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  p_Var1 = &(env->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node == p_Var1) {
    std::__cxx11::string::append((char *)&local_70);
    std::__cxx11::string::append((char *)&local_70,0x246bf1);
  }
  else {
    std::__cxx11::string::append((char *)&local_70,*(ulong *)(cVar2._M_node + 1));
    std::__cxx11::string::append((char *)&local_70,*(ulong *)(cVar2._M_node + 2));
  }
  p_Var3 = (env->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      if (p_Var3 != cVar2._M_node) {
        std::__cxx11::string::append((char *)&local_70,*(ulong *)(p_Var3 + 1));
        std::__cxx11::string::append((char *)&local_70,*(ulong *)(p_Var3 + 2));
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  todec_string<unsigned_long>(__return_storage_ptr__,local_68);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string make_scgi_header(std::map<std::string,std::string> const &env,size_t addon_size)
		{
			std::string env_str;
			env_str.reserve(1000);

			std::map<std::string,std::string>::const_iterator cl;

			cl=env.find("CONTENT_LENGTH");
			if(cl!=env.end()) {
				env_str.append(cl->first.c_str(),cl->first.size()+1);
				env_str.append(cl->second.c_str(),cl->second.size()+1);
			}
			else {
				env_str.append("CONTENT_LENGTH");
				env_str.append("\0" "0",3);
			}

			for(std::map<std::string,std::string>::const_iterator p=env.begin();p!=env.end();++p) {
				if(p==cl)
					continue;
				env_str.append(p->first.c_str(),p->first.size()+1);
				env_str.append(p->second.c_str(),p->second.size()+1);
			}
			std::string header=todec_string(env_str.size());
			header+=':';
			header.reserve(header.size()+env_str.size()+addon_size);
			header+=env_str;
			header+=',';
			return header;
		}